

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O2

bool __thiscall
ON_UuidPairList::AddPair(ON_UuidPairList *this,ON_UUID id1,ON_UUID id2,bool bCheckForDupicates)

{
  bool bVar1;
  ON_UuidPair *pOVar2;
  undefined3 in_register_00000089;
  ON_UUID_struct local_30;
  ON_UUID_struct local_20;
  
  local_30.Data4 = id2.Data4;
  local_30._0_8_ = id2._0_8_;
  local_20.Data4 = id1.Data4;
  local_20._0_8_ = id1._0_8_;
  if ((CONCAT31(in_register_00000089,bCheckForDupicates) != 0) &&
     (bVar1 = FindId1(this,id1,(ON_UUID *)0x0), bVar1)) {
    return false;
  }
  bVar1 = ::operator==(&ON_max_uuid,&local_20);
  if ((bVar1) && (bVar1 = ::operator==(&ON_max_uuid,&local_30), bVar1)) {
    return false;
  }
  pOVar2 = ON_SimpleArray<ON_UuidPair>::AppendNew(&this->super_ON_SimpleArray<ON_UuidPair>);
  pOVar2->m_uuid[0].Data1 = local_20.Data1;
  pOVar2->m_uuid[0].Data2 = local_20.Data2;
  pOVar2->m_uuid[0].Data3 = local_20.Data3;
  *&pOVar2->m_uuid[0].Data4 = local_20.Data4;
  pOVar2->m_uuid[1].Data1 = local_30.Data1;
  pOVar2->m_uuid[1].Data2 = local_30.Data2;
  pOVar2->m_uuid[1].Data3 = local_30.Data3;
  *&pOVar2->m_uuid[1].Data4 = local_30.Data4;
  return true;
}

Assistant:

bool ON_UuidPairList::AddPair(ON_UUID id1, ON_UUID id2, bool bCheckForDupicates)
{
  bool rc = bCheckForDupicates ? !FindId1(id1,0) : true;
  if (rc)
  {
    if ( ON_max_uuid == id1 && ON_max_uuid == id2 )
    {
      // The value pair (ON_max_uuid,ON_max_uuid) is used
      // to mark removed elements.
      rc = false;
    }
    else
    {
      ON_UuidPair& ui = AppendNew();
      ui.m_uuid[0] = id1;
      ui.m_uuid[1] = id2;
    }
  }
  return rc;
}